

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

vector<Record,_std::allocator<Record>_> * __thiscall
Block::getRecord(vector<Record,_std::allocator<Record>_> *__return_storage_ptr__,Block *this,
                float key)

{
  bool bVar1;
  reference pRVar2;
  undefined1 local_60 [8];
  Record record;
  iterator __end1;
  iterator __begin1;
  vector<Record,_std::allocator<Record>_> *__range1;
  float key_local;
  Block *this_local;
  vector<Record,_std::allocator<Record>_> *recordFound;
  
  std::vector<Record,_std::allocator<Record>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Record,_std::allocator<Record>_>::begin(&this->records);
  record._32_8_ = std::vector<Record,_std::allocator<Record>_>::end(&this->records);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>
                                     *)&record.averageRating), bVar1) {
    pRVar2 = __gnu_cxx::__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>::
             operator*(&__end1);
    Record::Record((Record *)local_60,pRVar2);
    if (((float)(int)record.tconst.field_2._12_4_ == key) &&
       (!NAN((float)(int)record.tconst.field_2._12_4_) && !NAN(key))) {
      std::vector<Record,_std::allocator<Record>_>::push_back
                (__return_storage_ptr__,(value_type *)local_60);
    }
    Record::~Record((Record *)local_60);
    __gnu_cxx::__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Record> Block::getRecord(float key) {
    std::vector<Record> recordFound;
    for (Record record : records) {
        if (record.numVotes == key) {
            recordFound.push_back(record);
            // return record;
        }
    }
    // return empty record, but should not happen
    return recordFound;
}